

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpinternalsourcedata.h
# Opt level: O2

void __thiscall jrtplib::RTPInternalSourceData::SentRTPPacket(RTPInternalSourceData *this)

{
  RTPTime RVar1;
  
  if ((this->super_RTPSourceData).ownssrc == true) {
    RVar1 = RTPTime::CurrentTime();
    (this->super_RTPSourceData).issender = true;
    (this->super_RTPSourceData).stats.lastrtptime.m_t = RVar1.m_t;
    (this->super_RTPSourceData).stats.lastmsgtime.m_t = RVar1.m_t;
  }
  return;
}

Assistant:

void SentRTPPacket()										{ if (!ownssrc) return; RTPTime t = RTPTime::CurrentTime(); issender = true; stats.SetLastRTPPacketTime(t); stats.SetLastMessageTime(t); }